

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c1499d::AV1Convolve2DHighbdTest_RunTest_Test::TestBody
          (AV1Convolve2DHighbdTest_RunTest_Test *this)

{
  uint src_stride;
  int h;
  int bd;
  int subpel_y_qn;
  int subpel_x_qn;
  ParamType *pPVar1;
  uint16_t *src;
  InterpFilterParams *pIVar2;
  InterpFilterParams *filter_params_x;
  long lVar3;
  uint height;
  long lVar4;
  InterpFilterParams *filter_params_y;
  ConvolveParams conv_params_1;
  ConvolveParams conv_params1;
  uint16_t test [16384];
  uint16_t reference [16384];
  ConvolveParams CStack_100c0;
  ConvolveParams CStack_10090;
  unsigned_short auStack_10060 [16384];
  
  subpel_x_qn = 1;
  do {
    subpel_y_qn = 1;
    do {
      lVar3 = 0;
      do {
        lVar4 = 0;
        do {
          if ((lVar4 == 0x40) == (lVar3 == 4)) {
            pPVar1 = testing::
                     WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
                     ::GetParam();
            src_stride = (pPVar1->block_).width_;
            pPVar1 = testing::
                     WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
                     ::GetParam();
            h = (pPVar1->block_).height_;
            pPVar1 = testing::
                     WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
                     ::GetParam();
            filter_params_x = av1_interp_filter_params_list + lVar3;
            if ((int)src_stride < 5) {
              filter_params_x = av1_interp_4tap + lVar3;
            }
            if (lVar3 == 4) {
              filter_params_x = av1_interp_filter_params_list + lVar3;
            }
            pIVar2 = (InterpFilterParams *)
                     ((long)&av1_interp_filter_params_list[0].filter_ptr + lVar4);
            filter_params_y = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + lVar4);
            if (4 < h) {
              filter_params_y = pIVar2;
            }
            bd = pPVar1->bd_;
            if (lVar4 == 0x40) {
              filter_params_y = pIVar2;
            }
            pPVar1 = testing::
                     WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
                     ::GetParam();
            src = AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                  ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                                   *)this,(this->super_AV1Convolve2DHighbdTest).
                                          super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                                          .input16_1_,pPVar1);
            CStack_10090.is_compound = 0;
            CStack_10090.use_dist_wtd_comp_avg = 0;
            CStack_10090.round_0 = 3;
            CStack_10090.round_1 = 0xb;
            if (10 < bd) {
              CStack_10090.round_1 = 0x15 - bd;
              CStack_10090.round_0 = bd + -7;
            }
            CStack_10090.dst = (CONV_BUF_TYPE *)0x0;
            CStack_10090.dst_stride = 0;
            CStack_10090.plane = 0;
            CStack_10090.do_average = 0;
            av1_highbd_convolve_2d_sr_c
                      (src,src_stride,(uint16_t *)&stack0xffffffffffff7fa0,0x80,src_stride,h,
                       filter_params_x,filter_params_y,subpel_x_qn,subpel_y_qn,&CStack_10090,bd);
            CStack_100c0.is_compound = 0;
            CStack_100c0.use_dist_wtd_comp_avg = 0;
            CStack_100c0.round_0 = 3;
            CStack_100c0.round_1 = 0xb;
            if (10 < bd) {
              CStack_100c0.round_1 = 0x15 - bd;
              CStack_100c0.round_0 = bd + -7;
            }
            CStack_100c0.dst = (CONV_BUF_TYPE *)0x0;
            CStack_100c0.dst_stride = 0;
            CStack_100c0.plane = 0;
            CStack_100c0.do_average = 0;
            pPVar1 = testing::
                     WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
                     ::GetParam();
            height = src_stride;
            (*pPVar1->test_func_)
                      (src,src_stride,auStack_10060,0x80,src_stride,h,filter_params_x,
                       filter_params_y,subpel_x_qn,subpel_y_qn,&CStack_100c0,bd);
            AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
            ::AssertOutputBufferEq
                      ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                        *)&stack0xffffffffffff7fa0,auStack_10060,(uint16_t *)(ulong)src_stride,h,
                       height);
          }
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x50);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 5);
      subpel_y_qn = subpel_y_qn + 1;
    } while (subpel_y_qn != 0x10);
    subpel_x_qn = subpel_x_qn + 1;
  } while (subpel_x_qn != 0x10);
  return;
}

Assistant:

TEST_P(AV1Convolve2DHighbdTest, RunTest) { RunTest(); }